

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest1_2::verifyXFBData
          (FunctionalTest1_2 *this,void *xfb_data,_variable_type *variable_type)

{
  float fVar1;
  ShaderType SVar2;
  ShaderType SVar3;
  bool bVar4;
  _variable_type _Var5;
  uint uVar6;
  long lVar7;
  _variable_type *variable_type_00;
  _variable_type *variable_type_01;
  _variable_type *variable_type_02;
  _variable_type *variable_type_03;
  uint uVar8;
  bool bVar9;
  float fVar10;
  double dVar11;
  float fVar12;
  double dVar13;
  string local_200;
  uint local_1dc;
  Utils *local_1d8;
  FunctionalTest1_2 *local_1d0;
  long local_1c8;
  long local_1c0;
  double local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  local_1d0 = this;
  _Var5 = Utils::getBaseVariableType(variable_type);
  local_1d8 = (Utils *)variable_type;
  uVar6 = Utils::getNumberOfComponentsForVariableType(variable_type);
  local_1dc = uVar6;
  if (_Var5 == VARIABLE_TYPE_BOOL) {
    bVar4 = true;
    lVar7 = 0;
    do {
      local_1c8 = lVar7;
      if (uVar6 != 0) {
        SVar2 = deqp::ShaderLoopTests::init::s_shaderTypes[lVar7];
        uVar8 = 1;
        do {
          SVar3 = *xfb_data;
          if (SVar3 == SVar2) {
            xfb_data = (void *)((long)xfb_data + 4);
          }
          else {
            local_1b0 = (undefined1  [8])
                        ((local_1d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
            ;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Invalid value reported by subroutine using [",0x2c);
            Utils::getVariableTypeGLSLString_abi_cxx11_(&local_200,local_1d8,variable_type_03);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," argument/return types (expected:[",0x22);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"], found:[",10)
            ;
            std::ostream::operator<<((ostringstream *)local_1a8,*xfb_data);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"])",2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            bVar4 = false;
          }
          uVar6 = local_1dc;
        } while ((SVar3 == SVar2) && (bVar9 = uVar8 < local_1dc, uVar8 = uVar8 + 1, bVar9));
      }
      lVar7 = local_1c8 + 1;
    } while (local_1c8 == 0);
  }
  else {
    bVar4 = true;
    lVar7 = 0;
    do {
      local_1c0 = lVar7;
      if (local_1dc != 0) {
        fVar1 = (float)(&DAT_01a9ae20)[lVar7];
        local_1c8 = CONCAT44(local_1c8._4_4_,(float)(uint)fVar1);
        local_1b8 = (double)(uint)fVar1;
        uVar6 = local_1dc;
        do {
          if ((int)_Var5 < 9) {
            if (_Var5 == VARIABLE_TYPE_DOUBLE) {
              dVar11 = *xfb_data - local_1b8;
              dVar13 = -dVar11;
              if (-dVar11 <= dVar11) {
                dVar13 = dVar11;
              }
              if (9.999999747378752e-06 < dVar13) {
                local_1b0 = (undefined1  [8])
                            ((local_1d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                            m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Invalid value reported by subroutine using [",0x2c)
                ;
                Utils::getVariableTypeGLSLString_abi_cxx11_(&local_200,local_1d8,variable_type_02);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_200._M_dataplus._M_p,
                           local_200._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," argument/return types (expected:[",0x22);
                std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"], found:[",10);
                std::ostream::_M_insert<double>(*xfb_data);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"])",2);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200._M_dataplus._M_p != &local_200.field_2) {
                  operator_delete(local_200._M_dataplus._M_p,
                                  local_200.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                bVar4 = false;
              }
              xfb_data = (void *)((long)xfb_data + 8);
            }
            else if (_Var5 == VARIABLE_TYPE_FLOAT) {
              fVar10 = *xfb_data - (float)local_1c8;
              fVar12 = -fVar10;
              if (-fVar10 <= fVar10) {
                fVar12 = fVar10;
              }
              if (1e-05 < fVar12) {
                local_1b0 = (undefined1  [8])
                            ((local_1d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                            m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Invalid value reported by subroutine using [",0x2c)
                ;
                Utils::getVariableTypeGLSLString_abi_cxx11_(&local_200,local_1d8,variable_type_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_200._M_dataplus._M_p,
                           local_200._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," argument/return types (expected:[",0x22);
                std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"], found:[",10);
                std::ostream::_M_insert<double>((double)*xfb_data);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"])",2);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200._M_dataplus._M_p != &local_200.field_2) {
                  operator_delete(local_200._M_dataplus._M_p,
                                  local_200.field_2._M_allocated_capacity + 1);
                }
                goto LAB_00979dbb;
              }
              goto LAB_00979dd6;
            }
          }
          else if ((_Var5 == VARIABLE_TYPE_INT) || (_Var5 == VARIABLE_TYPE_UINT)) {
            if (*xfb_data != fVar1) {
              local_1b0 = (undefined1  [8])
                          ((local_1d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Invalid value reported by subroutine using [",0x2c);
              Utils::getVariableTypeGLSLString_abi_cxx11_(&local_200,local_1d8,variable_type_01);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," argument/return types (expected:[",0x22);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"], found:[",10);
              std::ostream::operator<<((ostringstream *)local_1a8,(int)*xfb_data);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"])",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._M_dataplus._M_p != &local_200.field_2) {
                operator_delete(local_200._M_dataplus._M_p,
                                local_200.field_2._M_allocated_capacity + 1);
              }
LAB_00979dbb:
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              bVar4 = false;
            }
LAB_00979dd6:
            xfb_data = (void *)((long)xfb_data + 4);
          }
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      lVar7 = local_1c0 + 1;
    } while (local_1c0 == 0);
  }
  return bVar4;
}

Assistant:

bool FunctionalTest1_2::verifyXFBData(const void* xfb_data, const Utils::_variable_type& variable_type)
{
	const Utils::_variable_type base_variable_type		   = Utils::getBaseVariableType(variable_type);
	const float					epsilon					   = 1e-5f;
	const unsigned int			n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
	bool						result					   = true;
	const unsigned char*		traveller_ptr			   = (const unsigned char*)xfb_data;

	/* Boolean arguments/return types are tested with a slightly different shader so we
	 * need to test them in a separate code-path.
	 */
	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* 0 should be returned when getter0 is used, 1 otherwise */
		const unsigned int ref_values[] = { 0, 1 };
		const unsigned int n_ref_values = sizeof(ref_values) / sizeof(ref_values[0]);

		for (unsigned int n_ref_value = 0; n_ref_value < n_ref_values; ++n_ref_value)
		{
			const unsigned int ref_value = ref_values[n_ref_value];

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				int* result_value_ptr = (int*)(traveller_ptr);

				if (*result_value_ptr != (int)ref_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																   "["
									   << Utils::getVariableTypeGLSLString(variable_type) << "]"
									   << " argument/return types ("
										  "expected:["
									   << ref_value << "], found:[" << *result_value_ptr << "])"
									   << tcu::TestLog::EndMessage;

					result = false;
					break;
				}

				traveller_ptr += sizeof(int);
			} /* for (all components) */
		}	 /* for (all reference values) */
	}		  /* if (base_variable_type == Utils::VARIABLE_TYPE_BOOL) */
	else
	{
		/* 4 should be returned when getter0 is used, 5 otherwise */
		const unsigned int ref_values[] = { 4, 5 };
		const unsigned int n_ref_values = sizeof(ref_values) / sizeof(ref_values[0]);

		for (unsigned int n_ref_value = 0; n_ref_value < n_ref_values; ++n_ref_value)
		{
			const unsigned int ref_value = ref_values[n_ref_value];

			DE_ASSERT(
				base_variable_type == Utils::VARIABLE_TYPE_DOUBLE || base_variable_type == Utils::VARIABLE_TYPE_FLOAT ||
				base_variable_type == Utils::VARIABLE_TYPE_INT || base_variable_type == Utils::VARIABLE_TYPE_UINT);

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				const double* double_value_ptr = (double*)traveller_ptr;
				const float*  float_value_ptr  = (float*)traveller_ptr;
				const int*	int_value_ptr	= (int*)traveller_ptr;

				switch (base_variable_type)
				{
				case Utils::VARIABLE_TYPE_DOUBLE:
				{
					if (de::abs(*double_value_ptr - (double)ref_value) > epsilon)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																	   "["
										   << Utils::getVariableTypeGLSLString(variable_type) << "]"
										   << " argument/return types ("
											  "expected:["
										   << ref_value << "], found:[" << *double_value_ptr << "])"
										   << tcu::TestLog::EndMessage;

						result = false;
					}

					traveller_ptr += sizeof(double);
					break;
				}

				case Utils::VARIABLE_TYPE_FLOAT:
				{
					if (de::abs(*float_value_ptr - (float)ref_value) > epsilon)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																	   "["
										   << Utils::getVariableTypeGLSLString(variable_type) << "]"
										   << " argument/return types ("
											  "expected:["
										   << ref_value << "], found:[" << *float_value_ptr << "])"
										   << tcu::TestLog::EndMessage;

						result = false;
					}

					traveller_ptr += sizeof(float);
					break;
				}

				case Utils::VARIABLE_TYPE_INT:
				case Utils::VARIABLE_TYPE_UINT:
				{
					if (*int_value_ptr != (int)ref_value)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value reported by subroutine using "
																	   "["
										   << Utils::getVariableTypeGLSLString(variable_type) << "]"
										   << " argument/return types ("
											  "expected:["
										   << ref_value << "], found:[" << *int_value_ptr << "])"
										   << tcu::TestLog::EndMessage;

						result = false;
					}

					traveller_ptr += sizeof(int);
					break;
				}

				default:
					break;
				} /* switch (base_variable_type) */
			}	 /* for (all components) */
		}		  /* for (all reference values) */
	}

	return result;
}